

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  AsyncPipe *adapterConstructorParams;
  void *local_50;
  AsyncPipe *local_48;
  uchar *local_40;
  AsyncCapabilityStream *local_38;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s306;
  AsyncPipe *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  adapterConstructorParams = (AsyncPipe *)CONCAT44(in_register_00000034,__fd);
  _s306 = (AsyncCapabilityStream *)adapterConstructorParams;
  this_local = (AsyncPipe *)__buf;
  buffer_local.ptr = (uchar *)__n;
  buffer_local.size_ = (size_t)this;
  bVar1 = ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&this_local,(void *)0x0);
  if (bVar1) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    local_38 = kj::_::readMaybe<kj::AsyncCapabilityStream>(&adapterConstructorParams->state);
    s = local_38;
    if (local_38 == (AsyncCapabilityStream *)0x0) {
      local_50 = (void *)0x0;
      newAdaptedPromise<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite,kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char_const>&,decltype(nullptr)>
                ((kj *)this,adapterConstructorParams,(ArrayPtr<const_unsigned_char> *)&this_local,
                 &local_50);
    }
    else {
      local_48 = this_local;
      local_40 = buffer_local.ptr;
      (**(local_38->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream)
                (this,&(local_38->super_AsyncIoStream).super_AsyncOutputStream,this_local,
                 buffer_local.ptr);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) {
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.write(buffer);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, buffer, nullptr);
    }
  }